

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# monmove.c
# Opt level: O3

int dochugw(monst *mtmp)

{
  bool bVar1;
  boolean bVar2;
  int iVar3;
  uint uVar4;
  obj *poVar5;
  int iVar6;
  int x0;
  
  x0 = (int)mtmp->mx;
  iVar6 = (int)mtmp->my;
  if (occupation == (_func_int *)0x0) {
    bVar1 = true;
  }
  else {
    if (mtmp->wormno == '\0') {
      if ((viz_array[iVar6][x0] & 2U) != 0) goto LAB_001eef1a;
      if (u.uprops[0x1e].intrinsic == 0) {
        if ((ublindf != (obj *)0x0) && (ublindf->otyp != 0xed)) goto LAB_001eeebf;
        if (((youmonst.data)->mflags1 & 0x1000) != 0) goto LAB_001eeeb6;
      }
      else {
LAB_001eeeb6:
        if (ublindf == (obj *)0x0) goto LAB_001eef6f;
LAB_001eeebf:
        if (ublindf->oartifact != '\x1d') goto LAB_001eef6f;
      }
      if ((((u.uprops[0x40].extrinsic != 0 || u.uprops[0x40].intrinsic != 0) ||
           (((youmonst.data)->mflags3 & 0x100) != 0)) && ((viz_array[iVar6][x0] & 1U) != 0)) &&
         ((mtmp->data->mflags3 & 0x200) != 0)) goto LAB_001eef1a;
LAB_001eef6f:
      if (((mtmp->data->mflags1 & 0x10000) == 0) &&
         ((poVar5 = which_armor(mtmp,4), poVar5 == (obj *)0x0 ||
          (poVar5 = which_armor(mtmp,4), poVar5->otyp != 0x4f)))) {
        if (u.uprops[0x1e].intrinsic == 0) {
          if ((ublindf != (obj *)0x0) && (ublindf->otyp != 0xed)) goto LAB_001eefc7;
          if (((youmonst.data)->mflags1 & 0x1000) != 0) goto LAB_001eefc2;
        }
        else {
LAB_001eefc2:
          if (ublindf != (obj *)0x0) {
LAB_001eefc7:
            if (ublindf->oartifact == '\x1d') goto LAB_001ef063;
          }
          if ((((youmonst.data == mons + 0x31 || youmonst.data == mons + 0x1e) ||
               (u.uprops[0x19].extrinsic != 0 || u.uprops[0x19].intrinsic != 0)) ||
               youmonst.data == mons + 0x32) && (u.uprops[0x19].blocked == 0)) goto LAB_001ef0d4;
        }
LAB_001ef063:
        if ((u.uprops[0x19].extrinsic == 0) || (u.uprops[0x19].blocked != 0)) goto LAB_001ef0aa;
        iVar3 = dist2((int)mtmp->mx,(int)mtmp->my,(int)u.ux,(int)u.uy);
        bVar1 = false;
        if ((iVar3 < 0x41) || (bVar1 = false, u.uprops[0x42].intrinsic != 0)) goto LAB_001ef0d7;
      }
      else {
LAB_001ef0aa:
        if (u.uprops[0x42].intrinsic != 0) goto LAB_001ef0d4;
      }
      if (u.uprops[0x42].extrinsic == 0) {
        bVar2 = match_warn_of_mon(mtmp);
        bVar1 = bVar2 == '\0';
        goto LAB_001ef0d7;
      }
    }
    else {
      bVar2 = worm_known(level,mtmp);
      if (bVar2 == '\0') goto LAB_001eef6f;
LAB_001eef1a:
      uVar4 = *(uint *)&mtmp->field_0x60;
      if ((((uVar4 & 2) != 0) && (u.uprops[0xc].intrinsic == 0)) && (u.uprops[0xc].extrinsic == 0))
      {
        if (((uVar4 & 0x280) == 0) && (((youmonst.data)->mflags1 & 0x1000000) != 0))
        goto LAB_001eef62;
        goto LAB_001eef6f;
      }
      if ((uVar4 & 0x280) != 0) goto LAB_001eef6f;
LAB_001eef62:
      if ((u._1052_1_ & 0x20) != 0) goto LAB_001eef6f;
    }
LAB_001ef0d4:
    bVar1 = false;
  }
LAB_001ef0d7:
  iVar3 = dochug(mtmp);
  if (occupation == (_func_int *)0x0) {
    return iVar3;
  }
  if (iVar3 != 0) {
    return iVar3;
  }
  if (u.uprops[0x1c].intrinsic != 0) {
    return 0;
  }
  if ((mtmp->field_0x62 & 0x40) != 0) {
    if (u.uprops[0x23].intrinsic == 0) {
      return 0;
    }
    if (u.uprops[0x24].extrinsic != 0) {
      return 0;
    }
    if ((u.umonnum != u.umonster) && (bVar2 = dmgtype(youmonst.data,0x24), bVar2 != '\0')) {
      return 0;
    }
  }
  iVar3 = dist2((int)mtmp->mx,(int)mtmp->my,(int)u.ux,(int)u.uy);
  if (0x51 < iVar3) {
    return 0;
  }
  if (((!bVar1) && ((viz_array[iVar6][x0] & 1U) != 0)) &&
     (iVar6 = dist2(x0,iVar6,(int)u.ux,(int)u.uy), iVar6 < 0x52)) {
    return 0;
  }
  if (mtmp->wormno == '\0') {
    if ((viz_array[mtmp->my][mtmp->mx] & 2U) != 0) goto LAB_001ef2a8;
    if (u.uprops[0x1e].intrinsic == 0) {
      if ((ublindf != (obj *)0x0) && (ublindf->otyp != 0xed)) goto LAB_001ef24b;
      if (((youmonst.data)->mflags1 & 0x1000) != 0) goto LAB_001ef242;
    }
    else {
LAB_001ef242:
      if (ublindf == (obj *)0x0) goto LAB_001ef2f6;
LAB_001ef24b:
      if (ublindf->oartifact != '\x1d') goto LAB_001ef2f6;
    }
    if (((u.uprops[0x40].extrinsic != 0 || u.uprops[0x40].intrinsic != 0) ||
        (((youmonst.data)->mflags3 & 0x100) != 0)) &&
       (((viz_array[mtmp->my][mtmp->mx] & 1U) != 0 && ((mtmp->data->mflags3 & 0x200) != 0))))
    goto LAB_001ef2a8;
  }
  else {
    bVar2 = worm_known(level,mtmp);
    if (bVar2 != '\0') {
LAB_001ef2a8:
      uVar4 = *(uint *)&mtmp->field_0x60;
      if ((((uVar4 & 2) == 0) || (u.uprops[0xc].intrinsic != 0)) || (u.uprops[0xc].extrinsic != 0))
      {
        if ((uVar4 & 0x280) == 0) {
LAB_001ef2e8:
          if ((u._1052_1_ & 0x20) == 0) goto LAB_001ef45b;
        }
      }
      else if (((uVar4 & 0x280) == 0) && (((youmonst.data)->mflags1 & 0x1000000) != 0))
      goto LAB_001ef2e8;
    }
  }
LAB_001ef2f6:
  if (((mtmp->data->mflags1 & 0x10000) == 0) &&
     ((poVar5 = which_armor(mtmp,4), poVar5 == (obj *)0x0 ||
      (poVar5 = which_armor(mtmp,4), poVar5->otyp != 0x4f)))) {
    if (u.uprops[0x1e].intrinsic == 0) {
      if ((ublindf != (obj *)0x0) && (ublindf->otyp != 0xed)) goto LAB_001ef355;
      if (((youmonst.data)->mflags1 & 0x1000) != 0) goto LAB_001ef350;
LAB_001ef3e4:
      if ((u.uprops[0x19].extrinsic == 0) ||
         ((u.uprops[0x19].blocked != 0 ||
          (iVar6 = dist2((int)mtmp->mx,(int)mtmp->my,(int)u.ux,(int)u.uy), 0x40 < iVar6))))
      goto LAB_001ef41a;
    }
    else {
LAB_001ef350:
      if (ublindf != (obj *)0x0) {
LAB_001ef355:
        if (ublindf->oartifact == '\x1d') goto LAB_001ef3e4;
      }
      if ((((youmonst.data != mons + 0x31 && youmonst.data != mons + 0x1e) &&
           (u.uprops[0x19].extrinsic == 0 && u.uprops[0x19].intrinsic == 0)) &&
           youmonst.data != mons + 0x32) || (u.uprops[0x19].blocked != 0)) goto LAB_001ef3e4;
    }
  }
  else {
LAB_001ef41a:
    if ((u.uprops[0x42].intrinsic == 0) &&
       ((u.uprops[0x42].extrinsic == 0 && (bVar2 = match_warn_of_mon(mtmp), bVar2 == '\0')))) {
      return 0;
    }
  }
  if ((viz_array[mtmp->my][mtmp->mx] & 1U) == 0) {
    return 0;
  }
  uVar4 = *(uint *)&mtmp->field_0x60;
LAB_001ef45b:
  if ((((uVar4 >> 0x12 & 1) != 0) && (iVar6 = noattacks(mtmp->data), iVar6 == 0)) &&
     (bVar2 = onscary((int)u.ux,(int)u.uy,mtmp), bVar2 == '\0')) {
    stop_occupation();
  }
  return 0;
}

Assistant:

int dochugw(struct monst *mtmp)
{
	int x = mtmp->mx, y = mtmp->my;
	boolean already_saw_mon = !occupation ? 0 : canspotmon(level, mtmp);
	int rd = dochug(mtmp);

	/* a similar check is in monster_nearby() in hack.c */
	/* check whether hero notices monster and stops current activity */
	if (occupation && !rd && !Confusion &&
	    (!mtmp->mpeaceful || Hallucination) &&
	    /* it's close enough to be a threat */
	    distu(mtmp->mx,mtmp->my) <= (BOLT_LIM+1)*(BOLT_LIM+1) &&
	    /* and either couldn't see it before, or it was too far away */
	    (!already_saw_mon || !couldsee(x,y) ||
		distu(x,y) > (BOLT_LIM+1)*(BOLT_LIM+1)) &&
	    /* can see it now, or sense it and would normally see it */
	    (canseemon(level, mtmp) ||
		(sensemon(mtmp) && couldsee(mtmp->mx,mtmp->my))) &&
	    mtmp->mcanmove &&
	    !noattacks(mtmp->data) && !onscary(u.ux, u.uy, mtmp))
		stop_occupation();

	return rd;
}